

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avl.c
# Opt level: O0

void avl_remove(avl_tree *tree,avl_node *node)

{
  avl_node *paVar1;
  avl_node *paVar2;
  avl_node *paVar3;
  avl_node *paVar4;
  list_entity *__tempptr;
  avl_node *right;
  avl_node *left;
  avl_node *parent;
  avl_node *next;
  avl_node *node_local;
  avl_tree *tree_local;
  
  if ((node->follower & 1U) == 0) {
    if ((((tree->allow_dups & 1U) == 0) || ((avl_node *)(tree->list_head).prev == node)) ||
       (paVar1 = (avl_node *)(node->list).next, (paVar1->follower & 1U) == 0)) {
      _avl_remove_worker(tree,node);
    }
    else {
      paVar1->follower = false;
      paVar1->balance = node->balance;
      paVar2 = node->parent;
      paVar3 = node->left;
      paVar4 = node->right;
      paVar1->parent = paVar2;
      paVar1->left = paVar3;
      paVar1->right = paVar4;
      if (paVar2 == (avl_node *)0x0) {
        tree->root = paVar1;
      }
      else if (node == paVar2->left) {
        paVar2->left = paVar1;
      }
      else {
        paVar2->right = paVar1;
      }
      if (paVar3 != (avl_node *)0x0) {
        paVar3->parent = paVar1;
      }
      if (paVar4 != (avl_node *)0x0) {
        paVar4->parent = paVar1;
      }
    }
  }
  _avl_remove(tree,node);
  return;
}

Assistant:

void
avl_remove(struct avl_tree *tree, struct avl_node *node) {
  struct avl_node *next;
  struct avl_node *parent;
  struct avl_node *left;
  struct avl_node *right;
  if (!node->follower) {
    if (tree->allow_dups && !list_is_last(&tree->list_head, &node->list) &&
        (next = list_next_element(node, list))->follower) {
      next->follower = false;
      next->balance = node->balance;

      parent = node->parent;
      left = node->left;
      right = node->right;

      next->parent = parent;
      next->left = left;
      next->right = right;

      if (parent == NULL)
        tree->root = next;

      else {
        if (node == parent->left)
          parent->left = next;

        else
          parent->right = next;
      }

      if (left != NULL)
        left->parent = next;

      if (right != NULL)
        right->parent = next;
    }

    else
      _avl_remove_worker(tree, node);
  }

  _avl_remove(tree, node);
}